

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerCPP::emit_shared(CompilerCPP *this,SPIRVariable *var)

{
  uint32_t uVar1;
  string instance_name;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_38,this,(ulong)(var->super_IVariant).self.id,1);
  CompilerGLSL::variable_decl_abi_cxx11_(&local_58,&this->super_CompilerGLSL,var);
  CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_58,(char (*) [2])0x405f81);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  uVar1 = (this->super_CompilerGLSL).indent;
  (this->super_CompilerGLSL).indent = 0;
  CompilerGLSL::
  statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",&local_38,(char (*) [9])" __res->",
             &local_38);
  (this->super_CompilerGLSL).indent = uVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerCPP::emit_shared(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto instance_name = to_name(var.self);
	statement(CompilerGLSL::variable_decl(var), ";");
	statement_no_indent("#define ", instance_name, " __res->", instance_name);
}